

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  WhereLoop *pLoop;
  SrcList *pSVar5;
  Index *pIVar6;
  WhereTerm *pWVar7;
  ExprList *pEVar8;
  WhereTerm *pTerm;
  bool bVar9;
  u8 uVar10;
  LogEst LVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  u32 uVar16;
  ulong uVar17;
  short sVar18;
  ushort uVar19;
  ExprList_item *pEVar20;
  Expr *pA;
  ulong uVar21;
  ulong uVar22;
  WhereTerm *pWVar23;
  long lVar24;
  Index *pIdx;
  long lVar25;
  bool bVar26;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  uint local_fc;
  i16 local_d2;
  Table *local_d0;
  WhereInfo *local_c8;
  WhereClause *local_c0;
  Bitmask local_b8;
  ExprList_item *local_b0;
  ExprList *local_a8;
  LogEst local_9c [2];
  Index local_98;
  
  local_d2 = -1;
  pLoop = pBuilder->pNew;
  local_c8 = pBuilder->pWInfo;
  pSVar5 = local_c8->pTabList;
  bVar2 = pLoop->iTab;
  local_d0 = pSVar5->a[bVar2].pTab;
  pIVar6 = pSVar5->a[bVar2].pIBIndex;
  pIdx = pIVar6;
  if (pIVar6 == (Index *)0x0) {
    if ((local_d0->tabFlags & 0x20) == 0) {
      pIdx = &local_98;
      local_98.aColExpr = (ExprList *)0x0;
      local_98.zName = (char *)0x0;
      local_98.azColl = (char **)0x0;
      local_98.pPartIdxWhere = (Expr *)0x0;
      local_98.pSchema = (Schema *)0x0;
      local_98.aSortOrder = (u8 *)0x0;
      local_98.zColAff = (char *)0x0;
      local_98.pNext = (Index *)0x0;
      local_98.aiColumn = &local_d2;
      local_98.aiRowLogEst = local_9c;
      local_98.nColumn = 1;
      local_98.onError = '\x05';
      local_98._99_5_ = 0;
      local_98.pTable = local_d0;
      local_98._88_6_ = (uint6)(ushort)local_d0->szTabRow << 0x20;
      local_98.nKeyCol = 1;
      local_9c[0] = local_d0->nRowLogEst;
      local_9c[1] = 0;
      if ((pSVar5->a[bVar2].fg.field_0x1 & 1) == 0) {
        local_98.pNext = local_d0->pIndex;
      }
    }
    else {
      pIdx = local_d0->pIndex;
    }
  }
  local_c0 = pBuilder->pWC;
  sVar18 = local_d0->nRowLogEst;
  iVar15 = 0;
  sVar12 = 0;
  if (10 < (long)sVar18) {
    LVar11 = sqlite3LogEst((long)sVar18);
    sVar12 = LVar11 + -0x21;
  }
  iVar14 = 0;
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) &&
       (iVar14 = iVar15, (local_c8->wctrlFlags & 0x20) == 0)) &&
      ((local_c8->pParse->db->flags & 0x8000) != 0)) &&
     (((pIVar6 == (Index *)0x0 && (bVar3 = pSVar5->a[bVar2].fg.field_0x1, (bVar3 & 1) == 0)) &&
      (((bVar3 & 0x28) == 0 &&
       (((local_d0->tabFlags & 0x20) == 0 && (iVar15 = local_c0->nTerm, 0 < (long)iVar15)))))))) {
    pWVar7 = local_c0->a;
    sVar4 = sVar12 + sVar18 + 4;
    sVar18 = sVar12 + sVar18 + 0x1c;
    local_b0 = (ExprList_item *)CONCAT44(local_b0._4_4_,(int)sVar12);
    pTerm = pWVar7;
    do {
      pWVar23 = pTerm + 1;
      iVar14 = 0;
      if ((pTerm->prereqRight & pLoop->maskSelf) == 0) {
        iVar14 = 0;
        iVar13 = termCanDriveIndex(pTerm,pSVar5->a + bVar2,0);
        if (iVar13 != 0) {
          (pLoop->u).btree.nEq = 1;
          (pLoop->u).btree.pIndex = (Index *)0x0;
          pLoop->nLTerm = 1;
          pLoop->nSkip = 0;
          *pLoop->aLTerm = pTerm;
          pLoop->rSetup = sVar4;
          sVar12 = sVar4;
          if ((local_d0->pSelect == (Select *)0x0) && ((local_d0->tabFlags & 2) == 0)) {
            pLoop->rSetup = sVar18;
            sVar12 = sVar18;
          }
          if (sVar12 < 0) {
            pLoop->rSetup = 0;
          }
          pLoop->nOut = 0x2b;
          LVar11 = sqlite3LogEstAdd((LogEst)local_b0,0x2b);
          pLoop->rRun = LVar11;
          pLoop->wsFlags = 0x4000;
          pLoop->prereq = pTerm->prereqRight | mPrereq;
          iVar14 = whereLoopInsert((WhereLoopBuilder *)pBuilder->pWInfo,
                                   (WhereLoop *)pBuilder->pOrSet);
        }
      }
    } while ((iVar14 == 0) && (pTerm = pWVar23, pWVar23 < pWVar7 + iVar15));
  }
  if ((iVar14 == 0) && (pIdx != (Index *)0x0)) {
    local_fc = 1;
    local_b8 = mPrereq;
    do {
      if ((pIdx->pPartIdxWhere == (Expr *)0x0) ||
         (iVar15 = whereUsablePartialIndex(pSVar5->a[bVar2].iCursor,local_c0,pIdx->pPartIdxWhere),
         iVar15 != 0)) {
        sVar18 = *pIdx->aiRowLogEst;
        (pLoop->u).vtab.idxNum = 0;
        (pLoop->u).btree.nTop = 0;
        pLoop->nLTerm = 0;
        pLoop->nSkip = 0;
        pLoop->iSortIdx = '\0';
        pLoop->rSetup = 0;
        pLoop->prereq = mPrereq;
        pLoop->nOut = sVar18;
        (pLoop->u).btree.pIndex = pIdx;
        bVar9 = true;
        if (((pIdx->field_0x63 & 4) == 0) &&
           ((pEVar8 = pBuilder->pWInfo->pOrderBy, pEVar8 != (ExprList *)0x0 &&
            (iVar15 = pEVar8->nExpr, 0 < iVar15)))) {
          iVar14 = pSVar5->a[bVar2].iCursor;
          local_b0 = pEVar8->a;
          lVar24 = 0;
          local_a8 = pEVar8;
          do {
            pA = local_b0[lVar24].pExpr;
            while (pA != (Expr *)0x0) {
              if ((pA->flags >> 0xc & 1) == 0) goto LAB_002477d0;
              if ((pA->flags >> 0x12 & 1) == 0) {
                pEVar20 = (ExprList_item *)&pA->pLeft;
              }
              else {
                pEVar20 = ((pA->x).pList)->a;
              }
              pA = pEVar20->pExpr;
            }
            pA = (Expr *)0x0;
LAB_002477d0:
            if ((pA->op == 0x98) && (pA->iTable == iVar14)) {
              if (pA->iColumn < 0) {
LAB_002478c2:
                bVar9 = false;
                goto LAB_002478ca;
              }
              if ((ulong)pIdx->nKeyCol != 0) {
                uVar21 = 0;
                do {
                  if (pA->iColumn == pIdx->aiColumn[uVar21]) goto LAB_002478c2;
                  uVar21 = uVar21 + 1;
                } while (pIdx->nKeyCol != uVar21);
              }
            }
            else if ((pIdx->aColExpr != (ExprList *)0x0) && (uVar19 = pIdx->nKeyCol, uVar19 != 0)) {
              pEVar20 = pIdx->aColExpr->a;
              uVar21 = 0;
              do {
                if (pIdx->aiColumn[uVar21] == -2) {
                  iVar15 = sqlite3ExprCompare((Parse *)0x0,pA,pEVar20->pExpr,iVar14);
                  mPrereq = local_b8;
                  if (iVar15 == 0) goto LAB_002478c2;
                  uVar19 = pIdx->nKeyCol;
                }
                uVar21 = uVar21 + 1;
                pEVar20 = pEVar20 + 1;
              } while (uVar21 < uVar19);
              iVar15 = local_a8->nExpr;
              mPrereq = local_b8;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 < iVar15);
          bVar9 = true;
        }
LAB_002478ca:
        if (pIdx->tnum < 1) {
          uVar21 = (ulong)local_fc;
          if (bVar9) {
            uVar21 = 0;
          }
          pLoop->wsFlags = 0x100;
          pLoop->iSortIdx = (u8)uVar21;
          pLoop->rRun = sVar18 + 0x10;
LAB_00247a66:
          whereLoopOutputAdjust(local_c0,pLoop,sVar18);
          iVar15 = whereLoopInsert((WhereLoopBuilder *)pBuilder->pWInfo,
                                   (WhereLoop *)pBuilder->pOrSet);
          pLoop->nOut = sVar18;
          if (iVar15 != 0) {
            return iVar15;
          }
        }
        else {
          if ((pIdx->field_0x63 & 0x20) == 0) {
            if ((ulong)pIdx->nColumn == 0) {
              uVar21 = 0xffffffffffffffff;
            }
            else {
              uVar17 = (ulong)pIdx->nColumn + 1;
              uVar21 = 0;
              do {
                uVar22 = 1L << ((byte)pIdx->aiColumn[uVar17 - 2] & 0x3f);
                if (0x3e < (ushort)pIdx->aiColumn[uVar17 - 2]) {
                  uVar22 = 0;
                }
                uVar21 = uVar21 | uVar22;
                uVar17 = uVar17 - 1;
              } while (1 < uVar17);
              uVar21 = ~uVar21;
            }
            bVar26 = (pSVar5->a[bVar2].colUsed & uVar21) == 0;
            uVar16 = (bVar26 | 8) << 6;
          }
          else {
            bVar26 = true;
            uVar16 = 0x240;
          }
          pLoop->wsFlags = uVar16;
          uVar10 = (u8)local_fc;
          if (!bVar9) {
LAB_0024797f:
            pLoop->iSortIdx = uVar10;
            LVar11 = sVar18 + (short)((pIdx->szIdxRow * 0xf) / (int)local_d0->szTabRow) + 1;
            pLoop->rRun = LVar11;
            if (!bVar26) {
              sVar12 = sVar18 + 0x10;
              if (0 < (local_c8->sWC).nTerm) {
                iVar15 = pSVar5->a[bVar2].iCursor;
                lVar24 = 0x14;
                lVar25 = 0;
                do {
                  pWVar7 = (local_c8->sWC).a;
                  iVar14 = sqlite3ExprCoveredByIndex
                                     (*(Expr **)((long)pWVar7 + lVar24 + -0x14),iVar15,pIdx);
                  if (iVar14 == 0) break;
                  uVar19 = *(ushort *)((long)pWVar7 + lVar24 + -4);
                  if (0 < (short)uVar19) {
                    uVar19 = -(ushort)((*(byte *)((long)&pWVar7->pExpr + lVar24) & 0x82) == 0) |
                             0xffec;
                  }
                  sVar12 = uVar19 + sVar12;
                  lVar25 = lVar25 + 1;
                  lVar24 = lVar24 + 0x40;
                } while (lVar25 < (local_c8->sWC).nTerm);
                LVar11 = pLoop->rRun;
                mPrereq = local_b8;
              }
              LVar11 = sqlite3LogEstAdd(LVar11,sVar12);
              pLoop->rRun = LVar11;
            }
            goto LAB_00247a66;
          }
          uVar10 = '\0';
          if ((((local_d0->tabFlags & 0x20) != 0) || (pIdx->pPartIdxWhere != (Expr *)0x0)) ||
             ((bVar26 &&
              (((((pIdx->field_0x63 & 4) == 0 && (pIdx->szIdxRow < local_d0->szTabRow)) &&
                ((local_c8->wctrlFlags & 4) == 0)) &&
               ((sqlite3Config.bUseCis != 0 &&
                (uVar10 = '\0', (local_c8->pParse->db->dbOptFlags & 0x40) == 0))))))))
          goto LAB_0024797f;
        }
        pBuilder->bldFlags = 0;
        iVar15 = whereLoopAddBtreeIndex(pBuilder,pSVar5->a + bVar2,pIdx,0);
        if (pBuilder->bldFlags == 1) {
          pbVar1 = (byte *)((long)&local_d0->tabFlags + 1);
          *pbVar1 = *pbVar1 | 1;
        }
        if (pSVar5->a[bVar2].pIBIndex != (Index *)0x0) {
          return iVar15;
        }
      }
      else {
        iVar15 = 0;
      }
      if (iVar15 != 0) {
        return iVar15;
      }
      pIdx = pIdx->pNext;
      local_fc = local_fc + 1;
      iVar14 = 0;
    } while (pIdx != (Index *)0x0);
  }
  return iVar14;
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 1.375 (LogEst=4) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize + 4;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 24;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices
  */
  for(; rc==SQLITE_OK && pProbe; pProbe=pProbe->pNext, iSortIdx++){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->tnum<=0 ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & ~columnsInIndex(pProbe);
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif

    /* If there was an INDEXED BY clause, then only that one index is
    ** considered. */
    if( pSrc->pIBIndex ) break;
  }
  return rc;
}